

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O2

TPZGeoElSide * __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra>::SideSubElement
          (TPZGeoElSide *__return_storage_ptr__,TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra> *this,
          int side,int position)

{
  TPZReference *pTVar1;
  int64_t iVar2;
  ulong uVar3;
  TPZGeoEl *pTVar4;
  ostream *poVar5;
  TPZAutoPointer<TPZRefPattern> local_58;
  _func_int **local_50;
  TPZGeoElSide subGeoEl;
  
  pTVar1 = (this->fRefPattern).fRef;
  if ((pTVar1 == (TPZReference *)0x0) || (pTVar1->fPointer == (TPZRefPattern *)0x0)) {
    (__return_storage_ptr__->super_TPZSavable)._vptr_TPZSavable =
         (_func_int **)&PTR__TPZGeoElSide_0172da80;
    __return_storage_ptr__->fGeoEl = (TPZGeoEl *)0x0;
    __return_storage_ptr__->fSide = -1;
  }
  else {
    local_50 = (_func_int **)&PTR__TPZGeoElSide_0172da80;
    subGeoEl.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
    subGeoEl.fGeoEl = (TPZGeoEl *)0x0;
    subGeoEl.fSide = -1;
    (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>).super_TPZGeoEl +
                0x2b0))(&local_58);
    TPZRefPattern::SideSubGeoElSide((local_58.fRef)->fPointer,side,position,&subGeoEl);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&local_58);
    iVar2 = TPZGeoElSide::Id(&subGeoEl);
    if ((this->fSubEl).fStore[iVar2] == -1) {
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "TPZGeoElRefPattern<TGeo>::SideSubElement : Error subelement not found for side "
                              );
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,side);
      poVar5 = std::operator<<(poVar5," position ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,position);
      std::endl<char,std::char_traits<char>>(poVar5);
      subGeoEl.fSide = -1;
      pTVar4 = (TPZGeoEl *)0x0;
    }
    else {
      uVar3 = TPZGeoElSide::Id(&subGeoEl);
      pTVar4 = (TPZGeoEl *)
               (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>).
                                      super_TPZGeoEl + 0x1f8))(this,uVar3 & 0xffffffff);
    }
    (__return_storage_ptr__->super_TPZSavable)._vptr_TPZSavable = local_50;
    __return_storage_ptr__->fGeoEl = pTVar4;
    __return_storage_ptr__->fSide = subGeoEl.fSide;
  }
  return __return_storage_ptr__;
}

Assistant:

TPZGeoElSide TPZGeoElRefPattern<TGeo>::SideSubElement(int side,int position){
	TPZGeoElSide tmp;
	if(!fRefPattern) return tmp;
	TPZGeoElSide subGeoEl;
	this->GetRefPattern()->SideSubGeoElSide(side,position,subGeoEl);
	if (fSubEl[subGeoEl.Id()] == -1) {
		PZError << "TPZGeoElRefPattern<TGeo>::SideSubElement : Error subelement not found for side "
		<< side << " position " << position << std::endl;
		return TPZGeoElSide();
	}
	return TPZGeoElSide (SubElement(subGeoEl.Id()),subGeoEl.Side());
}